

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_job_queue_init_preallocated
                    (ma_job_queue_config *pConfig,void *pHeap,ma_job_queue *pQueue)

{
  ma_slot_allocator_config *in_RDX;
  ma_slot_allocator *in_RSI;
  ma_uint32 *in_RDI;
  ma_slot_allocator_config allocatorConfig;
  ma_job_queue_heap_layout heapLayout;
  ma_result result;
  size_t local_68;
  ma_job_queue_heap_layout *in_stack_ffffffffffffffa0;
  ma_slot_allocator *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  ma_result local_2c;
  
  if (in_RDX == (ma_slot_allocator_config *)0x0) {
    local_2c = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (ma_slot_allocator_config *)0x0) {
      memset(in_RDX,0,0x60);
    }
    local_2c = ma_job_queue_get_heap_layout
                         ((ma_job_queue_config *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                         );
    if (local_2c == MA_SUCCESS) {
      *(ma_slot_allocator **)(in_RDX + 0x14) = in_RSI;
      if ((in_RSI != (ma_slot_allocator *)0x0) && (local_68 != 0)) {
        memset(in_RSI,0,local_68);
      }
      in_RDX->capacity = *in_RDI;
      in_RDX[1].capacity = in_RDI[1];
      *(long *)(in_RDX + 0x10) = (long)&in_stack_ffffffffffffffa8->pGroups + (long)&in_RSI->pGroups;
      ma_slot_allocator_config_init(0x1ad758);
      local_2c = ma_slot_allocator_init_preallocated
                           (in_RDX,(void *)CONCAT44(local_2c,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
      if (local_2c == MA_SUCCESS) {
        if ((in_RDX->capacity & 1) == 0) {
          local_2c = MA_INVALID_OPERATION;
        }
        else {
          ma_slot_allocator_alloc(in_RSI,(ma_uint64 *)in_RDX);
          *(undefined8 *)(*(long *)(in_RDX + 0x10) + (*(ulong *)(in_RDX + 2) & 0xffff) * 0x68 + 8) =
               0xffffffffffffffff;
          *(undefined8 *)(in_RDX + 4) = *(undefined8 *)(in_RDX + 2);
          local_2c = MA_SUCCESS;
        }
      }
    }
  }
  return local_2c;
}

Assistant:

MA_API ma_result ma_job_queue_init_preallocated(const ma_job_queue_config* pConfig, void* pHeap, ma_job_queue* pQueue)
{
    ma_result result;
    ma_job_queue_heap_layout heapLayout;
    ma_slot_allocator_config allocatorConfig;

    if (pQueue == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pQueue);

    result = ma_job_queue_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pQueue->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pQueue->flags    = pConfig->flags;
    pQueue->capacity = pConfig->capacity;
    pQueue->pJobs    = (ma_job*)ma_offset_ptr(pHeap, heapLayout.jobsOffset);

    allocatorConfig = ma_slot_allocator_config_init(pConfig->capacity);
    result = ma_slot_allocator_init_preallocated(&allocatorConfig, ma_offset_ptr(pHeap, heapLayout.allocatorOffset), &pQueue->allocator);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need a semaphore if we're running in non-blocking mode. If threading is disabled we need to return an error. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_init(0, &pQueue->sem);
        }
        #else
        {
            /* Threading is disabled and we've requested non-blocking mode. */
            return MA_INVALID_OPERATION;
        }
        #endif
    }

    /*
    Our queue needs to be initialized with a free standing node. This should always be slot 0. Required for the lock free algorithm. The first job in the queue is
    just a dummy item for giving us the first item in the list which is stored in the "next" member.
    */
    ma_slot_allocator_alloc(&pQueue->allocator, &pQueue->head);  /* Will never fail. */
    pQueue->pJobs[ma_job_extract_slot(pQueue->head)].next = MA_JOB_ID_NONE;
    pQueue->tail = pQueue->head;

    return MA_SUCCESS;
}